

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::TexSubImage2D::TexSubImage2D
          (TexSubImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint xoffset,GLint yoffset,GLsizei width,GLsizei height,GLenum format,GLenum type,
          bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Texture *pTVar3;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"TexSubImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__TexSubImage2D_0215ee58;
  (this->m_texture).m_ptr = texture->m_ptr;
  pSVar2 = texture->m_state;
  (this->m_texture).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->m_level = level;
  this->m_xoffset = xoffset;
  this->m_yoffset = yoffset;
  this->m_width = width;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  local_40.m_ptr = &((this->m_texture).m_ptr)->super_Object;
  local_40.m_state = (this->m_texture).m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_40);
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_40.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40.m_ptr = (Object *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_40.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_40.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pTVar3 = (this->m_texture).m_ptr;
  local_50.m_ptr = &((pTVar3->sourceImage).m_ptr)->super_Object;
  if ((EGLImage *)local_50.m_ptr != (EGLImage *)0x0) {
    local_50.m_state = (pTVar3->sourceImage).m_state;
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    Operation::modifyGLObject(&this->super_Operation,&local_50);
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_50.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_50.m_ptr = (Object *)0x0;
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_50.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return;
}

Assistant:

TexSubImage2D::TexSubImage2D (SharedPtr<Texture> texture, GLint level, GLint xoffset, GLint yoffset, GLsizei width, GLsizei height, GLenum format, GLenum type, bool useSync, bool serverSync)
	: Operation		("TexSubImage2D", useSync, serverSync)
	, m_texture		(texture)
	, m_level		(level)
	, m_xoffset		(xoffset)
	, m_yoffset		(yoffset)
	, m_width		(width)
	, m_height		(height)
	, m_format		(format)
	, m_type		(type)
{
	modifyGLObject(SharedPtr<Object>(m_texture));

	if (m_texture->sourceImage)
		modifyGLObject(SharedPtr<Object>(m_texture->sourceImage));
}